

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O2

void __thiscall CVmObjTadsInhQueue::clear(CVmObjTadsInhQueue *this)

{
  pfq_ele *ppVar1;
  pfq_ele *cur;
  
  while (ppVar1 = this->head_, ppVar1 != (pfq_ele *)0x0) {
    this->head_ = ppVar1->nxt;
    ppVar1->nxt = this->free_;
    this->free_ = ppVar1;
  }
  return;
}

Assistant:

void clear()
    {
        /* move everything from the queue to the free list */
        while (head_ != 0)
        {
            pfq_ele *cur;

            /* unlink this element from the queue */
            cur = head_;
            head_ = cur->nxt;

            /* link it into the free list */
            cur->nxt = free_;
            free_ = cur;
        }
    }